

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3WalEndWriteTransaction(Wal *pWal)

{
  int in_EAX;
  
  if (pWal->writeLock != '\0') {
    if (pWal->exclusiveMode == '\0') {
      (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,9);
    }
    in_EAX = 0;
    pWal->writeLock = '\0';
    pWal->iReCksum = 0;
    pWal->truncateOnCommit = '\0';
  }
  return in_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalEndWriteTransaction(Wal *pWal){
  if( pWal->writeLock ){
    walUnlockExclusive(pWal, WAL_WRITE_LOCK, 1);
    pWal->writeLock = 0;
    pWal->iReCksum = 0;
    pWal->truncateOnCommit = 0;
  }
  return SQLITE_OK;
}